

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

Type * LLVMBC::Type::getTy(LLVMContext *context,TypeID id)

{
  Type *pTVar1;
  pointer ppTVar2;
  Vector<Type_*> *__range1;
  Type *type;
  TypeID local_1c;
  Type *local_18;
  
  ppTVar2 = (context->type_cache).
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppTVar2 ==
        (context->type_cache).
        super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_1c = id;
      local_18 = LLVMContext::construct<LLVMBC::Type,LLVMBC::LLVMContext&,LLVMBC::Type::TypeID&>
                           (context,context,&local_1c);
      std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::push_back
                (&context->type_cache,&local_18);
      return local_18;
    }
    pTVar1 = *ppTVar2;
    ppTVar2 = ppTVar2 + 1;
  } while (pTVar1->type_id != id);
  return pTVar1;
}

Assistant:

Type *Type::getTy(LLVMContext &context, TypeID id)
{
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
		if (type->getTypeID() == id)
			return type;

	auto *type = context.construct<Type>(context, id);
	cache.push_back(type);
	return type;
}